

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-util.h
# Opt level: O0

string * __thiscall
wabt::cat<std::basic_string_view<char,std::char_traits<char>>,char[2],std::__cxx11::string>
          (string *__return_storage_ptr__,wabt *this,
          basic_string_view<char,_std::char_traits<char>_> *args,char (*args_1) [2],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_2)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_local_2;
  char (*args_local_1) [2];
  basic_string_view<char,_std::char_traits<char>_> *args_local;
  string *s;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  cat_compute_size<std::basic_string_view<char,std::char_traits<char>>,char[2],std::__cxx11::string>
            ((basic_string_view<char,_std::char_traits<char>_> *)this,(char (*) [2])args,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_1);
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  cat_concatenate<std::basic_string_view<char,std::char_traits<char>>,char[2],std::__cxx11::string>
            (__return_storage_ptr__,(basic_string_view<char,_std::char_traits<char>_> *)this,
             (char (*) [2])args,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_1);
  return __return_storage_ptr__;
}

Assistant:

std::string cat(const Ts&... args) {
  std::string s;
  s.reserve(cat_compute_size(args...));
  cat_concatenate(s, args...);
  return s;
}